

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

void Sle_ManCollectCutFaninsOne
               (Gia_Man_t *pGia,int iObj,Vec_Int_t *vCuts,Vec_Bit_t *vMask,Vec_Int_t *vCutFanins,
               Vec_Bit_t *vMap)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  uint *puVar6;
  
  iVar2 = Vec_IntEntry(vCuts,iObj);
  piVar4 = Vec_IntEntryP(vCuts,iVar2);
  puVar6 = (uint *)(piVar4 + 1);
  iVar2 = 0;
  while( true ) {
    if (*piVar4 <= iVar2) {
      for (iVar2 = 0; iVar2 < vCutFanins->nSize; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(vCutFanins,iVar2);
        Vec_BitWriteEntry(vMap,iVar3,0);
      }
      return;
    }
    uVar1 = *puVar6;
    if ((uVar1 & 0xf) < 2) break;
    for (uVar5 = 0; (uVar1 & 0xf) != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = Vec_BitEntry(vMask,puVar6[uVar5 + 1]);
      if (iVar3 != 0) {
        iVar3 = Vec_BitEntry(vMap,puVar6[uVar5 + 1]);
        if (iVar3 == 0) {
          Vec_BitWriteEntry(vMap,puVar6[uVar5 + 1],1);
          Vec_IntPush(vCutFanins,puVar6[uVar5 + 1]);
        }
      }
    }
    iVar2 = iVar2 + 1;
    puVar6 = puVar6 + (ulong)(*puVar6 & 0xf) + 1;
  }
  __assert_fail("nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                ,0x17a,
                "void Sle_ManCollectCutFaninsOne(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *, Vec_Int_t *, Vec_Bit_t *)"
               );
}

Assistant:

void Sle_ManCollectCutFaninsOne( Gia_Man_t * pGia, int iObj, Vec_Int_t * vCuts, Vec_Bit_t * vMask, Vec_Int_t * vCutFanins, Vec_Bit_t * vMap )
{
    int i, iFanin, * pCut, * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    Sle_ForEachCut( pList, pCut, i )
    {
        int nSize   = Sle_CutSize(pCut);
        int k, * pC = Sle_CutLeaves(pCut);
        assert( nSize > 1 );
        for ( k = 0; k < nSize; k++ )
            if ( Vec_BitEntry(vMask, pC[k]) && !Vec_BitEntry(vMap, pC[k]) )
            {
                Vec_BitWriteEntry( vMap, pC[k], 1 );
                Vec_IntPush( vCutFanins, pC[k] );
            }
    }
    Vec_IntForEachEntry( vCutFanins, iFanin, i )
        Vec_BitWriteEntry( vMap, iFanin, 0 );
}